

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

void burstsort_sampling_vector_block(uchar **strings,size_t n)

{
  TrieNode<unsigned_char> *root_00;
  TrieNode<unsigned_char> *root;
  size_t n_local;
  uchar **strings_local;
  
  root_00 = pseudo_sample<unsigned_char>(strings,n);
  insert<16000u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_char>,unsigned_char>
            (root_00,strings,n);
  traverse<vector_block<unsigned_char*,128u>,void(*)(unsigned_char**,int,int),unsigned_char>
            (root_00,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort_sampling_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = pseudo_sample<CharT>(strings, n);
	insert<16000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}